

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.h
# Opt level: O0

ForeignMessageLite * __thiscall
proto2_unittest::TestAllTypesLite::_internal_mutable_optional_foreign_message
          (TestAllTypesLite *this)

{
  Arena *arena;
  ForeignMessageLite *pFVar1;
  ForeignMessageLite *p;
  TestAllTypesLite *this_local;
  
  if ((this->field_0)._impl_.optional_foreign_message_ == (ForeignMessageLite *)0x0) {
    arena = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
    pFVar1 = (ForeignMessageLite *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest::ForeignMessageLite>(arena);
    (this->field_0)._impl_.optional_foreign_message_ = pFVar1;
  }
  return (this->field_0)._impl_.optional_foreign_message_;
}

Assistant:

TestAllTypesLite::_internal_mutable_optional_foreign_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.optional_foreign_message_ == nullptr) {
    auto* p = ::google::protobuf::MessageLite::DefaultConstruct<::proto2_unittest::ForeignMessageLite>(GetArena());
    _impl_.optional_foreign_message_ = reinterpret_cast<::proto2_unittest::ForeignMessageLite*>(p);
  }
  return _impl_.optional_foreign_message_;
}